

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cpp
# Opt level: O1

IdSet * jsonnet::internal::static_analysis
                  (IdSet *__return_storage_ptr__,AST *ast_,bool in_object,IdSet *vars)

{
  Identifier **__v;
  pointer *pppIVar1;
  size_type *__v_00;
  _Base_ptr p_Var2;
  _Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> _Var3;
  unsigned_long uVar4;
  size_type sVar5;
  _func_int **pp_Var6;
  iterator __position;
  long lVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  StaticError *pSVar11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  Bind *bind_1;
  _Rb_tree_header *p_Var14;
  _func_int **pp_Var15;
  Field *field;
  ArgParam *arg;
  unsigned_long uVar16;
  AST *pAVar17;
  size_type sVar18;
  bool bVar19;
  pair<std::_Rb_tree_iterator<const_jsonnet::internal::Identifier_*>,_std::_Rb_tree_iterator<const_jsonnet::internal::Identifier_*>_>
  pVar20;
  IdSet new_vars;
  IdSet params;
  IdSet fv;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  size_t local_d8;
  _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
  *local_d0;
  undefined1 local_c8 [32];
  _Base_ptr local_a8;
  size_t local_a0;
  undefined1 local_98 [48];
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  _Base_ptr local_38;
  
  local_38 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_38;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = (_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
              *)__return_storage_ptr__;
  switch(ast_->type) {
  case AST_APPLY:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Apply::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x2e,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_100);
    uVar16 = *(unsigned_long *)((long)&ast_[1].location.file.field_2 + 8);
    uVar4 = ast_[1].location.begin.line;
    if (uVar16 != uVar4) {
      do {
        static_analysis((IdSet *)local_100,*(AST **)(uVar16 + 0x38),in_object,vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                            local_100._24_8_,(_Base_ptr)(local_100 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_100);
        uVar16 = uVar16 + 0x58;
      } while (uVar16 != uVar4);
    }
    break;
  case AST_APPLY_BRACE:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&ApplyBrace::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x35,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_ARRAY:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Array::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x39,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    pp_Var15 = ast_[1]._vptr_AST;
    pp_Var6 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    if (pp_Var15 != pp_Var6) {
      do {
        static_analysis((IdSet *)local_100,(AST *)*pp_Var15,in_object,vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                            local_100._24_8_,(_Base_ptr)(local_100 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_100);
        pp_Var15 = pp_Var15 + 4;
      } while (pp_Var15 != pp_Var6);
    }
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ",0x1d);
    poVar12 = std::ostream::_M_insert<void_const*>(&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar12);
    abort();
  case AST_BINARY:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Binary::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x3f,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_100);
    static_analysis((IdSet *)local_100,(AST *)ast_[1].location.begin.line,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    goto LAB_00161b4d;
  case AST_BUILTIN_FUNCTION:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&BuiltinFunction::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x45,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_CONDITIONAL:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Conditional::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x49,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_100);
    static_analysis((IdSet *)local_100,*(AST **)((long)&ast_[1].location.file.field_2 + 8),in_object
                    ,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_100);
    static_analysis((IdSet *)local_100,(AST *)ast_[1].location.end.column,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    goto LAB_00161b4d;
  case AST_DESUGARED_OBJECT:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&DesugaredObject::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xaa,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    sVar18 = ast_[1].location.file.field_2._M_allocated_capacity;
    sVar5 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
    if (sVar18 != sVar5) {
      do {
        static_analysis((IdSet *)local_100,*(AST **)(sVar18 + 8),in_object,vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                            local_100._24_8_,(_Base_ptr)(local_100 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_100);
        static_analysis((IdSet *)local_100,*(AST **)(sVar18 + 0x10),true,vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                            local_100._24_8_,(_Base_ptr)(local_100 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_100);
        sVar18 = sVar18 + 0x18;
      } while (sVar18 != sVar5);
    }
    pAVar17 = (AST *)ast_[1]._vptr_AST;
    if (pAVar17 != ast_ + 1) {
      do {
        static_analysis((IdSet *)local_100,(AST *)(pAVar17->location).file._M_string_length,true,
                        vars);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                            local_100._24_8_,(_Base_ptr)(local_100 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_100);
        pAVar17 = (AST *)pAVar17->_vptr_AST;
      } while (pAVar17 != ast_ + 1);
    }
    break;
  case AST_ERROR:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Error::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x50,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    goto LAB_00161b4d;
  case AST_FUNCTION:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Function::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x55,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_100,&vars->_M_t);
    p_Var2 = (_Base_ptr)(local_c8 + 8);
    local_c8._8_4_ = _S_red;
    local_c8._16_8_ = (_Base_ptr)0x0;
    local_a0 = 0;
    sVar5 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
    local_c8._24_8_ = p_Var2;
    local_a8 = p_Var2;
    for (sVar18 = ast_[1].location.file.field_2._M_allocated_capacity; sVar18 != sVar5;
        sVar18 = sVar18 + 0x58) {
      __v = (Identifier **)(sVar18 + 0x18);
      p_Var9 = p_Var2;
      if ((_Base_ptr)local_c8._16_8_ != (_Base_ptr)0x0) {
        p_Var10 = (_Base_ptr)local_c8._16_8_;
        do {
          if (*(Identifier **)(p_Var10 + 1) >= *__v) {
            p_Var9 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(Identifier **)(p_Var10 + 1) < *__v];
        } while (p_Var10 != (_Base_ptr)0x0);
      }
      p_Var13 = p_Var2;
      if ((p_Var9 != p_Var2) && (p_Var13 = p_Var9, *__v < *(Identifier **)(p_Var9 + 1))) {
        p_Var13 = p_Var2;
      }
      if (p_Var13 != p_Var2) {
        encode_utf8((string *)local_98,&(*__v)->name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,"Duplicate function parameter: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
        pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
        StaticError::StaticError(pSVar11,&ast_->location,(string *)local_68);
        __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
      }
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_c8,__v);
      std::
      _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
      ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                  *)local_100,__v);
    }
    static_analysis((IdSet *)local_68,
                    (AST *)ast_[1].openFodder.
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           ._M_impl.super__Vector_impl_data._M_start,in_object,(IdSet *)local_100);
    sVar18 = ast_[1].location.file.field_2._M_allocated_capacity;
    sVar5 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
    if (sVar18 != sVar5) {
      do {
        if (*(AST **)(sVar18 + 0x38) != (AST *)0x0) {
          static_analysis((IdSet *)local_98,*(AST **)(sVar18 + 0x38),in_object,(IdSet *)local_100);
          std::
          _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
          ::
          _M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                    ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                      *)local_68,
                     (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_98._24_8_
                     ,(_Base_ptr)(local_98 + 8));
          std::
          _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                       *)local_98);
        }
        sVar18 = sVar18 + 0x58;
      } while (sVar18 != sVar5);
    }
    sVar18 = ast_[1].location.file.field_2._M_allocated_capacity;
    sVar5 = *(size_type *)((long)&ast_[1].location.file.field_2 + 8);
    if (sVar18 != sVar5) {
      do {
        pVar20 = std::
                 _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 ::equal_range((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                *)local_68,(key_type *)(sVar18 + 0x18));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::_M_erase_aux((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)local_68,(_Base_ptr)pVar20.first._M_node,(_Base_ptr)pVar20.second._M_node)
        ;
        sVar18 = sVar18 + 0x58;
      } while (sVar18 != sVar5);
    }
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                        local_68._24_8_,(_Base_ptr)(local_68 + 8));
    goto LAB_00161b36;
  case AST_IMPORT:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Import::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x6c,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_IMPORTSTR:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Importstr::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x70,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_IMPORTBIN:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Importbin::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x74,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_INDEX:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Index::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x7f,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1]._vptr_AST,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_100);
    static_analysis((IdSet *)local_100,(AST *)ast_[1].location.begin.line,in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    goto LAB_00161b4d;
  case AST_IN_SUPER:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&InSuper::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x78,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if (!in_object) {
      pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"Can\'t use super outside of an object.","");
      StaticError::StaticError(pSVar11,&ast_->location,(string *)local_100);
      __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1]._vptr_AST,true,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    goto LAB_00161b4d;
  case AST_LITERAL_BOOLEAN:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralBoolean::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x9a,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LITERAL_NULL:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNull::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xa6,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LITERAL_NUMBER:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNumber::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x9e,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LITERAL_STRING:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralString::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xa2,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case AST_LOCAL:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Local::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x85,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    _Var3._M_node = (_Base_ptr)(local_100 + 8);
    local_100._8_4_ = _S_red;
    local_100._16_8_ = (_Base_ptr)0x0;
    local_d8 = 0;
    pp_Var15 = ast_[1]._vptr_AST;
    pp_Var6 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    local_100._24_8_ = _Var3._M_node;
    local_e0 = _Var3._M_node;
    if (pp_Var15 != pp_Var6) {
      do {
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)local_100,(Identifier **)(pp_Var15 + 3));
        pp_Var15 = pp_Var15 + 0x16;
      } while (pp_Var15 != pp_Var6);
    }
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_c8,&vars->_M_t);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_c8,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               _Var3);
    _Var3._M_node = (_Base_ptr)(local_68 + 8);
    local_68._8_4_ = _S_red;
    local_68._16_8_ = (_Base_ptr)0x0;
    local_40 = 0;
    pp_Var15 = ast_[1]._vptr_AST;
    pp_Var6 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    local_68._24_8_ = _Var3._M_node;
    local_48 = _Var3._M_node;
    if (pp_Var15 != pp_Var6) {
      do {
        static_analysis((IdSet *)local_98,(AST *)pp_Var15[7],in_object,(IdSet *)local_c8);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)local_68,
                   (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_98._24_8_,
                   (_Base_ptr)(local_98 + 8));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                     *)local_98);
        pp_Var15 = pp_Var15 + 0x16;
      } while (pp_Var15 != pp_Var6);
    }
    static_analysis((IdSet *)local_98,(AST *)ast_[1].location.file.field_2._M_allocated_capacity,
                    in_object,(IdSet *)local_c8);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_68,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_98._24_8_,
               (_Base_ptr)(local_98 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_98);
    pp_Var15 = ast_[1]._vptr_AST;
    pp_Var6 = (_func_int **)ast_[1].location.file._M_dataplus._M_p;
    if (pp_Var15 != pp_Var6) {
      do {
        pVar20 = std::
                 _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 ::equal_range((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                                *)local_68,(key_type *)(pp_Var15 + 3));
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::_M_erase_aux((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)local_68,(_Base_ptr)pVar20.first._M_node,(_Base_ptr)pVar20.second._M_node)
        ;
        pp_Var15 = pp_Var15 + 0x16;
      } while (pp_Var15 != pp_Var6);
    }
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              (local_d0,(_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)
                        local_68._24_8_,_Var3);
LAB_00161b36:
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_68);
LAB_00161b43:
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_c8);
    goto LAB_00161b4d;
  case AST_OBJECT_COMPREHENSION_SIMPLE:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0),
       lVar7 == 0)) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xb5,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_100,&vars->_M_t);
    __v_00 = &ast_[1].location.file._M_string_length;
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)local_100,(Identifier **)__v_00);
    static_analysis((IdSet *)local_c8,(AST *)ast_[1]._vptr_AST,false,(IdSet *)local_100);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_c8._24_8_,
               (_Base_ptr)(local_c8 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_c8);
    static_analysis((IdSet *)local_c8,(AST *)ast_[1].location.file._M_dataplus._M_p,true,
                    (IdSet *)local_100);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_c8._24_8_,
               (_Base_ptr)(local_c8 + 8));
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_c8);
    pVar20 = std::
             _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
             ::equal_range(&__return_storage_ptr__->_M_t,(key_type *)__v_00);
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::_M_erase_aux(&__return_storage_ptr__->_M_t,(_Base_ptr)pVar20.first._M_node,
                   (_Base_ptr)pVar20.second._M_node);
    static_analysis((IdSet *)local_c8,(AST *)ast_[1].location.file.field_2._M_allocated_capacity,
                    in_object,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_c8._24_8_,
               (_Base_ptr)(local_c8 + 8));
    goto LAB_00161b43;
  case AST_SELF:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Self::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xbf,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if (!in_object) {
      pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"Can\'t use self outside of an object.","");
      StaticError::StaticError(pSVar11,&ast_->location,(string *)local_100);
      __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
    }
    break;
  case AST_SUPER_INDEX:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&SuperIndex::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xc4,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if (!in_object) {
      pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"Can\'t use super outside of an object.","");
      StaticError::StaticError(pSVar11,&ast_->location,(string *)local_100);
      __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1].location.file.field_2._M_allocated_capacity,
                    true,vars);
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
    goto LAB_00161b4d;
  case AST_UNARY:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Unary::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xcb,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((IdSet *)local_100,(AST *)ast_[1].location.file._M_dataplus._M_p,in_object,vars)
    ;
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<jsonnet::internal::Identifier_const*>>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>)local_100._24_8_,
               (_Base_ptr)(local_100 + 8));
LAB_00161b4d:
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)local_100);
    break;
  case AST_VAR:
    if ((ast_ == (AST *)0x0) ||
       (lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Var::typeinfo,0), lVar7 == 0)) {
      __assert_fail("dynamic_cast<const Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xd0,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    pAVar17 = ast_ + 1;
    p_Var10 = (vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var14 = &(vars->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var14->_M_header;
    if (p_Var10 != (_Base_ptr)0x0) {
      do {
        bVar19 = *(Identifier **)(p_Var10 + 1) < (Identifier *)pAVar17->_vptr_AST;
        if (!bVar19) {
          p_Var8 = p_Var10;
        }
        p_Var10 = (&p_Var10->_M_left)[bVar19];
      } while (p_Var10 != (_Base_ptr)0x0);
    }
    p_Var10 = &p_Var14->_M_header;
    if (((_Rb_tree_header *)p_Var8 != p_Var14) &&
       (p_Var10 = p_Var8, (Identifier *)pAVar17->_vptr_AST < *(Identifier **)(p_Var8 + 1))) {
      p_Var10 = &p_Var14->_M_header;
    }
    if ((_Rb_tree_header *)p_Var10 == p_Var14) {
      pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
      encode_utf8((string *)local_c8,(UString *)ast_[1]._vptr_AST);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     "Unknown variable: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      StaticError::StaticError(pSVar11,&ast_->location,(string *)local_100);
      __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
    }
    std::
    _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
    ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
              ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                *)__return_storage_ptr__,(Identifier **)pAVar17);
  }
  p_Var8 = local_38;
  p_Var10 = *(_Base_ptr *)(local_d0 + 0x18);
  if (p_Var10 != local_38) {
    do {
      local_100._0_8_ = *(undefined8 *)(p_Var10 + 1);
      __position._M_current =
           (ast_->freeVariables).
           super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (ast_->freeVariables).
          super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_realloc_insert<jsonnet::internal::Identifier_const*const&>
                  ((vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)&ast_->freeVariables,__position,(Identifier **)local_100);
      }
      else {
        *__position._M_current = (Identifier *)local_100._0_8_;
        pppIVar1 = &(ast_->freeVariables).
                    super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var8);
  }
  return (IdSet *)local_d0;
}

Assistant:

static IdSet static_analysis(AST *ast_, bool in_object, const IdSet &vars)
{
    IdSet r;

    switch (ast_->type) {
    case AST_APPLY: {
        assert(dynamic_cast<Apply *>(ast_));
        auto* ast = static_cast<Apply *>(ast_);
        append(r, static_analysis(ast->target, in_object, vars));
        for (const auto &arg : ast->args)
            append(r, static_analysis(arg.expr, in_object, vars));
    } break;
    case AST_APPLY_BRACE: {
        assert(dynamic_cast<ApplyBrace *>(ast_));
        // Nothing to do.
    } break;
    case AST_ARRAY: {
        assert(dynamic_cast<Array *>(ast_));
        auto* ast = static_cast<Array *>(ast_);
        for (auto &el : ast->elements)
            append(r, static_analysis(el.expr, in_object, vars));
    } break;
    case AST_BINARY: {
        assert(dynamic_cast<Binary *>(ast_));
        auto* ast = static_cast<Binary *>(ast_);
        append(r, static_analysis(ast->left, in_object, vars));
        append(r, static_analysis(ast->right, in_object, vars));
    } break;
    case AST_BUILTIN_FUNCTION: {
        assert(dynamic_cast<BuiltinFunction *>(ast_));
        // Nothing to do.
    } break;
    case AST_CONDITIONAL: {
        assert(dynamic_cast<Conditional *>(ast_));
        auto* ast = static_cast<Conditional *>(ast_);
        append(r, static_analysis(ast->cond, in_object, vars));
        append(r, static_analysis(ast->branchTrue, in_object, vars));
        append(r, static_analysis(ast->branchFalse, in_object, vars));
    } break;
    case AST_ERROR: {
        assert(dynamic_cast<Error *>(ast_));
        auto* ast = static_cast<Error *>(ast_);
        append(r, static_analysis(ast->expr, in_object, vars));
    } break;
    case AST_FUNCTION: {
        assert(dynamic_cast<Function *>(ast_));
        auto* ast = static_cast<Function *>(ast_);
        auto new_vars = vars;
        IdSet params;
        for (const auto &p : ast->params) {
            if (params.find(p.id) != params.end()) {
                std::string msg = "Duplicate function parameter: " + encode_utf8(p.id->name);
                throw StaticError(ast_->location, msg);
            }
            params.insert(p.id);
            new_vars.insert(p.id);
        }

        auto fv = static_analysis(ast->body, in_object, new_vars);
        for (const auto &p : ast->params) {
            if (p.expr != nullptr)
                append(fv, static_analysis(p.expr, in_object, new_vars));
        }
        for (const auto &p : ast->params)
            fv.erase(p.id);
        append(r, fv);
    } break;
    case AST_IMPORT: {
        assert(dynamic_cast<Import *>(ast_));
        // Nothing to do.
    } break;
    case AST_IMPORTSTR: {
        assert(dynamic_cast<Importstr *>(ast_));
        // Nothing to do.
    } break;
    case AST_IMPORTBIN: {
        assert(dynamic_cast<Importbin *>(ast_));
        // Nothing to do.
    } break;
    case AST_IN_SUPER: {
        assert(dynamic_cast<const InSuper *>(ast_));
        auto* ast = static_cast<const InSuper *>(ast_);
        if (!in_object)
            throw StaticError(ast_->location, "Can't use super outside of an object.");
        append(r, static_analysis(ast->element, in_object, vars));
    } break;
    case AST_INDEX: {
        assert(dynamic_cast<const Index *>(ast_));
        auto* ast = static_cast<const Index *>(ast_);
        append(r, static_analysis(ast->target, in_object, vars));
        append(r, static_analysis(ast->index, in_object, vars));
    } break;
    case AST_LOCAL: {
        assert(dynamic_cast<const Local *>(ast_));
        auto* ast = static_cast<const Local *>(ast_);
        IdSet ast_vars;
        for (const auto &bind : ast->binds) {
            ast_vars.insert(bind.var);
        }
        auto new_vars = vars;
        append(new_vars, ast_vars);
        IdSet fvs;
        for (const auto &bind : ast->binds) {
            append(fvs, static_analysis(bind.body, in_object, new_vars));
        }

        append(fvs, static_analysis(ast->body, in_object, new_vars));

        for (const auto &bind : ast->binds)
            fvs.erase(bind.var);

        append(r, fvs);
    } break;
    case AST_LITERAL_BOOLEAN: {
        assert(dynamic_cast<const LiteralBoolean *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_NUMBER: {
        assert(dynamic_cast<const LiteralNumber *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_STRING: {
        assert(dynamic_cast<const LiteralString *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_NULL: {
        assert(dynamic_cast<const LiteralNull *>(ast_));
        // Nothing to do.
    } break;
    case AST_DESUGARED_OBJECT: {
        assert(dynamic_cast<DesugaredObject *>(ast_));
        auto* ast = static_cast<DesugaredObject *>(ast_);
        for (auto &field : ast->fields) {
            append(r, static_analysis(field.name, in_object, vars));
            append(r, static_analysis(field.body, true, vars));
        }
        for (AST *assert : ast->asserts) {
            append(r, static_analysis(assert, true, vars));
        }
    } break;
    case AST_OBJECT_COMPREHENSION_SIMPLE: {
        assert(dynamic_cast<ObjectComprehensionSimple *>(ast_));
        auto* ast = static_cast<ObjectComprehensionSimple *>(ast_);
        auto new_vars = vars;
        new_vars.insert(ast->id);
        append(r, static_analysis(ast->field, false, new_vars));
        append(r, static_analysis(ast->value, true, new_vars));
        r.erase(ast->id);
        append(r, static_analysis(ast->array, in_object, vars));
    } break;
    case AST_SELF: {
        assert(dynamic_cast<const Self *>(ast_));
        if (!in_object)
            throw StaticError(ast_->location, "Can't use self outside of an object.");
    } break;
    case AST_SUPER_INDEX: {
        assert(dynamic_cast<const SuperIndex *>(ast_));
        auto* ast = static_cast<const SuperIndex *>(ast_);
        if (!in_object)
            throw StaticError(ast_->location, "Can't use super outside of an object.");
        append(r, static_analysis(ast->index, in_object, vars));
    } break;
    case AST_UNARY: {
        assert(dynamic_cast<const Unary *>(ast_));
        auto* ast = static_cast<const Unary *>(ast_);
        append(r, static_analysis(ast->expr, in_object, vars));
    } break;
    case AST_VAR: {
        assert(dynamic_cast<const Var *>(ast_));
        auto* ast = static_cast<const Var *>(ast_);
        if (vars.find(ast->id) == vars.end()) {
            throw StaticError(ast->location, "Unknown variable: " + encode_utf8(ast->id->name));
        }
        r.insert(ast->id);
    } break;
    default:
        std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
        std::abort();
        break;
    }

    for (auto *id : r)
        ast_->freeVariables.push_back(id);

    return r;
}